

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O1

btVectorXf * __thiscall
btLemkeAlgorithm::solve(btVectorXf *__return_storage_ptr__,btLemkeAlgorithm *this,uint maxloops)

{
  float fVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  btVectorXf *pbVar6;
  int iVar7;
  uint uVar8;
  undefined4 uVar9;
  long lVar10;
  btMatrixX<float> *pbVar11;
  int *piVar12;
  long lVar13;
  int numRows;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  btMatrixX<float> *this_00;
  btAlignedObjectArray<int> *in_R8;
  ulong uVar17;
  uint rows;
  ulong uVar18;
  btMatrixX<float> *pbVar19;
  bool bVar20;
  int iVar22;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int pivotColIndex;
  btAlignedObjectArray<int> basis;
  btMatrixXf A;
  btMatrixXf ident;
  btMatrixXf mNeg;
  int local_17c;
  btMatrixX<float> *local_178;
  btAlignedObjectArray<int> local_170;
  btVectorXf *local_150;
  ulong local_148;
  ulong local_140;
  btMatrixX<float> local_138;
  btMatrixX<float> local_e0;
  btMatrixX<float> local_88;
  
  *(undefined4 *)(this + 0x80) = 0;
  rows = *(uint *)(this + 100);
  uVar18 = (ulong)rows;
  pbVar19 = (btMatrixX<float> *)(long)(int)rows;
  uVar15 = (long)pbVar19 * 2;
  numRows = (int)uVar15;
  local_178 = (btMatrixX<float> *)this;
  btVectorX<float>::btVectorX(__return_storage_ptr__,numRows);
  lVar13 = (long)(__return_storage_ptr__->m_storage).m_size;
  if (lVar13 != 0) {
    memset((__return_storage_ptr__->m_storage).m_data,0,lVar13 << 2);
  }
  local_150 = __return_storage_ptr__;
  btMatrixX<float>::btMatrixX(&local_e0,rows,rows);
  btMatrixX<float>::setIdentity(&local_e0);
  btMatrixX<float>::negative(&local_88,(btMatrixX<float> *)&local_178->m_operations);
  this_00 = &local_138;
  btMatrixX<float>::btMatrixX(this_00,rows,numRows + 2);
  if (0 < (long)local_e0.m_rows) {
    in_R8 = (btAlignedObjectArray<int> *)(ulong)(uint)local_138.m_setElemOperations;
    lVar13 = 0;
    this_00 = (btMatrixX<float> *)local_138.m_storage.m_data;
    do {
      if (0 < local_e0.m_cols) {
        uVar17 = 0;
        do {
          (&this_00->m_rows)[uVar17] = (int)local_e0.m_storage.m_data[uVar17];
          uVar17 = uVar17 + 1;
        } while ((uint)local_e0.m_cols != uVar17);
        local_138.m_setElemOperations = (int)in_R8 + local_e0.m_cols;
        in_R8 = (btAlignedObjectArray<int> *)(ulong)(uint)local_138.m_setElemOperations;
      }
      lVar13 = lVar13 + 1;
      this_00 = (btMatrixX<float> *)(&this_00->m_rows + local_138.m_cols);
      local_e0.m_storage.m_data = local_e0.m_storage.m_data + local_e0.m_cols;
    } while (lVar13 != local_e0.m_rows);
  }
  if (0 < (long)local_88.m_rows) {
    this_00 = (btMatrixX<float> *)(ulong)(uint)local_138.m_setElemOperations;
    in_R8 = (btAlignedObjectArray<int> *)((int *)local_138.m_storage.m_data + (long)pbVar19);
    lVar13 = 0;
    do {
      if (0 < local_88.m_cols) {
        uVar17 = 0;
        do {
          *(float *)((long)&in_R8->field_0x0 + uVar17 * 4) = local_88.m_storage.m_data[uVar17];
          uVar17 = uVar17 + 1;
        } while ((uint)local_88.m_cols != uVar17);
        local_138.m_setElemOperations = (int)this_00 + local_88.m_cols;
        this_00 = (btMatrixX<float> *)(ulong)(uint)local_138.m_setElemOperations;
      }
      lVar13 = lVar13 + 1;
      in_R8 = (btAlignedObjectArray<int> *)((long)&in_R8->field_0x0 + (long)local_138.m_cols * 4);
      local_88.m_storage.m_data = local_88.m_storage.m_data + local_88.m_cols;
    } while (lVar13 != local_88.m_rows);
  }
  auVar5 = _DAT_001f5270;
  if (0 < (int)rows) {
    lVar10 = (long)local_138.m_cols;
    piVar12 = (int *)local_138.m_storage.m_data + (uVar15 & 0xffffffff);
    uVar17 = (ulong)(rows + 3 & 0xfffffffc);
    lVar13 = uVar18 - 1;
    auVar21._8_4_ = (int)lVar13;
    auVar21._0_8_ = lVar13;
    auVar21._12_4_ = (int)((ulong)lVar13 >> 0x20);
    this_00 = (btMatrixX<float> *)(lVar10 * 0xc);
    in_R8 = (btAlignedObjectArray<int> *)(lVar10 * 0x10);
    auVar21 = auVar21 ^ _DAT_001f5270;
    auVar23 = _DAT_001f57f0;
    auVar24 = _DAT_001f55c0;
    do {
      auVar25 = auVar24 ^ auVar5;
      iVar22 = auVar21._4_4_;
      if ((bool)(~(auVar25._4_4_ == iVar22 && auVar21._0_4_ < auVar25._0_4_ ||
                  iVar22 < auVar25._4_4_) & 1)) {
        *piVar12 = -0x40800000;
      }
      if ((auVar25._12_4_ != auVar21._12_4_ || auVar25._8_4_ <= auVar21._8_4_) &&
          auVar25._12_4_ <= auVar21._12_4_) {
        piVar12[lVar10] = -0x40800000;
      }
      auVar25 = auVar23 ^ auVar5;
      iVar7 = auVar25._4_4_;
      if (iVar7 <= iVar22 && (iVar7 != iVar22 || auVar25._0_4_ <= auVar21._0_4_)) {
        piVar12[lVar10 * 2] = -0x40800000;
        piVar12[lVar10 * 3] = -0x40800000;
      }
      lVar13 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 4;
      auVar24._8_8_ = lVar13 + 4;
      lVar13 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 4;
      auVar23._8_8_ = lVar13 + 4;
      piVar12 = piVar12 + lVar10 * 4;
      uVar17 = uVar17 - 4;
    } while (uVar17 != 0);
    local_138.m_setElemOperations = local_138.m_setElemOperations + rows;
  }
  local_148 = uVar15 | 1;
  iVar22 = local_178[1].m_resizeOperations;
  if (0 < (long)iVar22) {
    lVar13 = *(long *)&local_178[1].m_storage;
    this_00 = (btMatrixX<float> *)((int *)local_138.m_storage.m_data + local_148);
    in_R8 = (btAlignedObjectArray<int> *)0x0;
    do {
      this_00->m_rows = *(int *)(lVar13 + (long)in_R8 * 4);
      in_R8 = (btAlignedObjectArray<int> *)((long)in_R8 + 1);
      this_00 = (btMatrixX<float> *)(&this_00->m_rows + local_138.m_cols);
    } while ((btAlignedObjectArray<int> *)(long)iVar22 != in_R8);
    local_138.m_setElemOperations = local_138.m_setElemOperations + iVar22;
  }
  uVar14 = 0;
  local_170.m_data = (int *)0x0;
  local_170.m_size = 0;
  local_170.m_capacity = 0;
  local_140 = uVar18;
  if (0 < (int)rows) {
    do {
      local_170.m_ownsMemory = true;
      pbVar11 = (btMatrixX<float> *)local_170.m_data;
      iVar22 = local_170.m_capacity;
      if (local_170.m_size == local_170.m_capacity) {
        iVar7 = local_170.m_size * 2;
        if (local_170.m_size == 0) {
          iVar7 = 1;
        }
        if (local_170.m_capacity < iVar7) {
          if (iVar7 == 0) {
            pbVar11 = (btMatrixX<float> *)0x0;
          }
          else {
            pbVar11 = (btMatrixX<float> *)btAlignedAllocInternal((long)iVar7 << 2,0x10);
          }
          if (0 < (long)local_170.m_size) {
            lVar13 = 0;
            do {
              (&pbVar11->m_rows)[lVar13] = local_170.m_data[lVar13];
              lVar13 = lVar13 + 1;
            } while (local_170.m_size != lVar13);
          }
          this_00 = (btMatrixX<float> *)local_170.m_data;
          uVar18 = local_140;
          iVar22 = iVar7;
          if (((btMatrixX<float> *)local_170.m_data != (btMatrixX<float> *)0x0) &&
             (local_170.m_ownsMemory == true)) {
            btAlignedFreeInternal(local_170.m_data);
            this_00 = (btMatrixX<float> *)local_170.m_data;
            uVar18 = local_140;
          }
        }
      }
      local_170.m_capacity = iVar22;
      local_170.m_data = &pbVar11->m_rows;
      local_170.m_data[local_170.m_size] = uVar14;
      local_170.m_size = local_170.m_size + 1;
      uVar14 = uVar14 + 1;
      rows = (uint)uVar18;
    } while (uVar14 != rows);
  }
  local_170.m_ownsMemory = true;
  if ((int)rows < 1) {
    bVar20 = true;
    iVar22 = -1;
  }
  else {
    piVar12 = (int *)local_138.m_storage.m_data + (local_148 & 0xffffffff);
    uVar15 = 0xffffffff;
    bVar20 = true;
    this_00 = (btMatrixX<float> *)0x0;
    fVar3 = 1e+30;
    do {
      fVar1 = (float)*piVar12;
      if (fVar1 < fVar3) {
        uVar15 = (ulong)this_00 & 0xffffffff;
      }
      iVar22 = (int)uVar15;
      fVar4 = fVar1;
      if (fVar3 <= fVar1) {
        fVar4 = fVar3;
      }
      if (fVar1 < 0.0) {
        bVar20 = false;
      }
      this_00 = (btMatrixX<float> *)((long)&this_00->m_rows + 1);
      piVar12 = piVar12 + local_138.m_cols;
      fVar3 = fVar4;
    } while (pbVar19 != this_00);
  }
  pbVar19 = local_178;
  local_17c = numRows;
  if (!bVar20) {
    uVar14 = 100;
    if (maxloops != 0) {
      uVar14 = maxloops;
    }
    *(undefined4 *)&local_178[1].m_storage.m_data = 0;
    iVar7 = iVar22;
    do {
      GaussJordanEliminationStep((btLemkeAlgorithm *)this_00,&local_138,iVar7,numRows,in_R8);
      pbVar19 = local_178;
      iVar16 = -rows;
      if (local_170.m_data[iVar7] < (int)local_140) {
        iVar16 = (int)local_140;
      }
      iVar16 = iVar16 + local_170.m_data[iVar7];
      local_170.m_data[iVar7] = numRows;
      this_00 = local_178;
      local_17c = iVar16;
      iVar7 = findLexicographicMinimum((btLemkeAlgorithm *)local_178,&local_138,&local_17c);
      if (iVar22 == iVar7) {
        GaussJordanEliminationStep((btLemkeAlgorithm *)this_00,&local_138,iVar7,iVar16,in_R8);
        local_170.m_data[iVar7] = iVar16;
        break;
      }
      uVar8 = *(int *)&pbVar19[1].m_storage.m_data + 1;
      *(uint *)&pbVar19[1].m_storage.m_data = uVar8;
      numRows = iVar16;
    } while (uVar8 < uVar14);
    uVar15 = (ulong)local_170.m_size;
    bVar20 = (long)uVar15 < 1;
    if (0 < (long)uVar15) {
      uVar9 = 0xffffffff;
      if (SBORROW4(*local_170.m_data,local_170.m_size * 2) ==
          *local_170.m_data + local_170.m_size * -2 < 0) goto LAB_001d7252;
      uVar18 = 1;
      do {
        uVar17 = uVar18;
        if (uVar15 == uVar17) break;
        uVar18 = uVar17 + 1;
      } while (SBORROW4(local_170.m_data[uVar17],local_170.m_size * 2) !=
               local_170.m_data[uVar17] + local_170.m_size * -2 < 0);
      bVar20 = uVar15 <= uVar17;
    }
    uVar9 = 0xffffffff;
    if (!bVar20) goto LAB_001d7252;
  }
  if ((long)local_170.m_size < 1) {
    uVar9 = 0;
  }
  else {
    piVar12 = (int *)local_138.m_storage.m_data + (int)local_148;
    pfVar2 = (local_150->m_storage).m_data;
    uVar9 = 0;
    lVar13 = 0;
    do {
      pfVar2[local_170.m_data[lVar13]] = (float)*piVar12;
      lVar13 = lVar13 + 1;
      piVar12 = piVar12 + local_138.m_cols;
    } while (local_170.m_size != lVar13);
  }
LAB_001d7252:
  pbVar6 = local_150;
  *(undefined4 *)&pbVar19[1].m_storage.m_ownsMemory = uVar9;
  btAlignedObjectArray<int>::~btAlignedObjectArray(&local_170);
  btAlignedObjectArray<btAlignedObjectArray<int>_>::~btAlignedObjectArray
            (&local_138.m_rowNonZeroElements1);
  btAlignedObjectArray<float>::~btAlignedObjectArray(&local_138.m_storage);
  btAlignedObjectArray<btAlignedObjectArray<int>_>::~btAlignedObjectArray
            (&local_88.m_rowNonZeroElements1);
  btAlignedObjectArray<float>::~btAlignedObjectArray(&local_88.m_storage);
  btAlignedObjectArray<btAlignedObjectArray<int>_>::~btAlignedObjectArray
            (&local_e0.m_rowNonZeroElements1);
  btAlignedObjectArray<float>::~btAlignedObjectArray(&local_e0.m_storage);
  return pbVar6;
}

Assistant:

btVectorXu btLemkeAlgorithm::solve(unsigned int maxloops /* = 0*/)
{
  
    
    steps = 0;

    int dim = m_q.size();
#ifdef BT_DEBUG_OSTREAM
    if(DEBUGLEVEL >= 1) {
      cout << "Dimension = " << dim << endl;
    }
#endif //BT_DEBUG_OSTREAM

	btVectorXu solutionVector(2 * dim);
	solutionVector.setZero();
	  
	  //, INIT, 0.);

	btMatrixXu ident(dim, dim);
	ident.setIdentity();
#ifdef BT_DEBUG_OSTREAM
	cout << m_M << std::endl;
#endif

	btMatrixXu mNeg = m_M.negative();
	  
    btMatrixXu A(dim, 2 * dim + 2);
	//
	A.setSubMatrix(0, 0, dim - 1, dim - 1,ident);
	A.setSubMatrix(0, dim, dim - 1, 2 * dim - 1,mNeg);
	A.setSubMatrix(0, 2 * dim, dim - 1, 2 * dim, -1.f);
	A.setSubMatrix(0, 2 * dim + 1, dim - 1, 2 * dim + 1,m_q);

#ifdef BT_DEBUG_OSTREAM
	cout << A << std::endl;
#endif //BT_DEBUG_OSTREAM


 //   btVectorXu q_;
 //   q_ >> A(0, 2 * dim + 1, dim - 1, 2 * dim + 1);

    btAlignedObjectArray<int> basis;
    //At first, all w-values are in the basis
    for (int i = 0; i < dim; i++)
      basis.push_back(i);

	int pivotRowIndex = -1;
	btScalar minValue = 1e30f;
	bool greaterZero = true;
	for (int i=0;i<dim;i++)
	{
		btScalar v =A(i,2*dim+1);
		if (v<minValue)
		{
			minValue=v;
			pivotRowIndex = i;
		}
		if (v<0)
			greaterZero = false;
	}
	

	
  //  int pivotRowIndex = q_.minIndex();//minIndex(q_);     // first row is that with lowest q-value
    int z0Row = pivotRowIndex;           // remember the col of z0 for ending algorithm afterwards
    int pivotColIndex = 2 * dim;         // first col is that of z0

#ifdef BT_DEBUG_OSTREAM
    if (DEBUGLEVEL >= 3)
	{
    //  cout << "A: " << A << endl;
      cout << "pivotRowIndex " << pivotRowIndex << endl;
      cout << "pivotColIndex " << pivotColIndex << endl;
      cout << "Basis: ";
      for (int i = 0; i < basis.size(); i++)
        cout << basis[i] << " ";
      cout << endl;
    }
#endif //BT_DEBUG_OSTREAM

	if (!greaterZero)
	{

      if (maxloops == 0) {
		  maxloops = 100;
//        maxloops = UINT_MAX; //TODO: not a really nice way, problem is: maxloops should be 2^dim (=1<<dim), but this could exceed UINT_MAX and thus the result would be 0 and therefore the lemke algorithm wouldn't start but probably would find a solution within less then UINT_MAX steps. Therefore this constant is used as a upper border right now...
      }

      /*start looping*/
      for(steps = 0; steps < maxloops; steps++) {

        GaussJordanEliminationStep(A, pivotRowIndex, pivotColIndex, basis);
#ifdef BT_DEBUG_OSTREAM
        if (DEBUGLEVEL >= 3) {
        //  cout << "A: " << A << endl;
          cout << "pivotRowIndex " << pivotRowIndex << endl;
          cout << "pivotColIndex " << pivotColIndex << endl;
          cout << "Basis: ";
          for (int i = 0; i < basis.size(); i++)
            cout << basis[i] << " ";
          cout << endl;
        }
#endif //BT_DEBUG_OSTREAM

        int pivotColIndexOld = pivotColIndex;

        /*find new column index */
        if (basis[pivotRowIndex] < dim) //if a w-value left the basis get in the correspondent z-value
          pivotColIndex = basis[pivotRowIndex] + dim;
        else
          //else do it the other way round and get in the corresponding w-value
          pivotColIndex = basis[pivotRowIndex] - dim;

        /*the column becomes part of the basis*/
        basis[pivotRowIndex] = pivotColIndexOld;

        pivotRowIndex = findLexicographicMinimum(A, pivotColIndex);

        if(z0Row == pivotRowIndex) { //if z0 leaves the basis the solution is found --> one last elimination step is necessary
          GaussJordanEliminationStep(A, pivotRowIndex, pivotColIndex, basis);
          basis[pivotRowIndex] = pivotColIndex; //update basis
          break;
      }

      }
#ifdef BT_DEBUG_OSTREAM
      if(DEBUGLEVEL >= 1) {
        cout << "Number of loops: " << steps << endl;
        cout << "Number of maximal loops: " << maxloops << endl;
      }
#endif //BT_DEBUG_OSTREAM

      if(!validBasis(basis)) {
        info = -1;
#ifdef BT_DEBUG_OSTREAM
        if(DEBUGLEVEL >= 1)
          cerr << "Lemke-Algorithm ended with Ray-Termination (no valid solution)." << endl;
#endif //BT_DEBUG_OSTREAM

        return solutionVector;
      }

    }
#ifdef BT_DEBUG_OSTREAM
    if (DEBUGLEVEL >= 2) {
     // cout << "A: " << A << endl;
      cout << "pivotRowIndex " << pivotRowIndex << endl;
      cout << "pivotColIndex " << pivotColIndex << endl;
    }
#endif //BT_DEBUG_OSTREAM

    for (int i = 0; i < basis.size(); i++)
	{
      solutionVector[basis[i]] = A(i,2*dim+1);//q_[i];
	}

    info = 0;

    return solutionVector;
  }